

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Vta_ManUnsatCoreRemap(Vta_Man_t *p,Vec_Int_t *vCore)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  if (0 < vCore->nSize) {
    piVar2 = vCore->pArray;
    lVar3 = 0;
    do {
      iVar1 = piVar2[lVar3];
      lVar4 = (long)iVar1;
      if ((lVar4 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                      ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
      }
      piVar2[lVar3] = p->pObjs[lVar4].iFrame << ((byte)p->nObjBits & 0x1f) | p->pObjs[lVar4].iObj;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCore->nSize);
  }
  return;
}

Assistant:

void Vta_ManUnsatCoreRemap( Vta_Man_t * p, Vec_Int_t * vCore )
{
    Vta_Obj_t * pThis;
    int i, Entry;
    Vec_IntForEachEntry( vCore, Entry, i )
    {
        pThis = Vta_ManObj( p, Entry );
        Entry = (pThis->iFrame << p->nObjBits) | pThis->iObj;
        Vec_IntWriteEntry( vCore, i, Entry );
    }
}